

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall ConvexDecomposition::Array<int>::allocate(Array<int> *this,int s)

{
  int *__ptr;
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
  }
  if (s < this->count) {
    __assert_fail("s>=count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c0,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
  }
  __ptr = this->element;
  this->array_size = s;
  piVar1 = (int *)malloc((ulong)(uint)s << 2);
  this->element = piVar1;
  if (piVar1 == (int *)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
  }
  if (0 < this->count) {
    uVar2 = 1;
    if (1 < this->count) {
      uVar2 = (ulong)(uint)this->count;
    }
    uVar3 = 0;
    do {
      piVar1[uVar3] = __ptr[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}